

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O0

void alloc_mb_mode_info_buffers(AV1_COMP *cpi)

{
  int iVar1;
  AV1_COMP *in_RDI;
  AV1_COMMON *unaff_retaddr;
  AV1_COMMON *cm;
  BLOCK_SIZE in_stack_ffffffffffffffef;
  AV1_COMMON *pAVar2;
  
  pAVar2 = &in_RDI->common;
  iVar1 = av1_alloc_context_buffers
                    ((AV1_COMMON *)in_RDI,(int)((ulong)pAVar2 >> 0x20),(int)pAVar2,
                     in_stack_ffffffffffffffef);
  if (iVar1 != 0) {
    aom_internal_error(pAVar2->error,AOM_CODEC_MEM_ERROR,"Failed to allocate context buffers");
  }
  iVar1 = is_stat_generation_stage(in_RDI);
  if (iVar1 == 0) {
    alloc_context_buffers_ext(unaff_retaddr,(MBMIExtFrameBufferInfo *)in_RDI);
  }
  return;
}

Assistant:

static inline void alloc_mb_mode_info_buffers(AV1_COMP *const cpi) {
  AV1_COMMON *const cm = &cpi->common;
  if (av1_alloc_context_buffers(cm, cm->width, cm->height,
                                cpi->sf.part_sf.default_min_partition_size)) {
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate context buffers");
  }

  if (!is_stat_generation_stage(cpi))
    alloc_context_buffers_ext(cm, &cpi->mbmi_ext_info);
}